

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pixie_provider.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::PixieProvider::PriceSyncVisitor::HandlePriceUpdateEvent
          (PriceSyncVisitor *this,uint32_t sid,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
          *price,SubjectSetRegister *subjectSetRegister,bool replaceAllFields)

{
  bool bVar1;
  reference to_copy;
  undefined1 local_48 [8];
  Subject subject;
  bool replaceAllFields_local;
  SubjectSetRegister *subjectSetRegister_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  *price_local;
  uint32_t sid_local;
  PriceSyncVisitor *this_local;
  
  subject.components_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = replaceAllFields;
  to_copy = std::
            vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
            ::at(this->subject_set_,(ulong)sid);
  price::subject::Subject::Subject((Subject *)local_48,to_copy);
  bVar1 = SubjectSetRegister::IsCurrentlySubscribed(subjectSetRegister,(Subject *)local_48);
  if (bVar1) {
    provider::AbstractProvider::PublishPriceUpdate
              (&this->pixie_provider->super_AbstractProvider,(Subject *)local_48,price,
               (bool)(subject.components_.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1));
  }
  price::subject::Subject::~Subject((Subject *)local_48);
  return;
}

Assistant:

void PixieProvider::PriceSyncVisitor::HandlePriceUpdateEvent(uint32_t sid, std::map<std::string, PriceField>& price, SubjectSetRegister& subjectSetRegister,
                                                             bool replaceAllFields)
{
    Subject subject = subject_set_.at(sid);
    if (subjectSetRegister.IsCurrentlySubscribed(subject))
    {
        pixie_provider.PublishPriceUpdate(subject, price, replaceAllFields);
    }
}